

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmNinjaNormalTargetGenerator.cxx
# Opt level: O3

void __thiscall
cmNinjaNormalTargetGenerator::WriteDeviceLinkStatements
          (cmNinjaNormalTargetGenerator *this,string *config,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *architectures,string *output)

{
  PositionType *pPVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  _Rb_tree_header *p_Var4;
  cmNinjaVars *this_00;
  pointer pcVar5;
  pointer pbVar6;
  cmLocalNinjaGenerator *this_01;
  cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *pcVar7;
  size_type sVar8;
  int iVar9;
  cmGlobalNinjaGenerator *this_02;
  cmGlobalNinjaGenerator *this_03;
  string *psVar10;
  mapped_type *pmVar11;
  cmGeneratedFileStream *pcVar12;
  undefined8 uVar13;
  pointer pbVar14;
  _func_int **pp_Var15;
  _Alloc_hider _Var16;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_00;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_01;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_02;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_03;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_04;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_05;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_06;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_07;
  string_view source;
  string_view source_00;
  string frameworkPath;
  undefined1 local_428 [8];
  string linkPath;
  cmNinjaLinkLineDeviceComputer linkLineComputer;
  string linkLibs;
  string ninjaOutputDir;
  string objectDir;
  cmNinjaDeps explicitDeps;
  string local_2f0;
  cmNinjaBuild dcompile;
  key_type local_1b0;
  string local_190;
  string local_170;
  cmNinjaBuild fatbinary;
  
  paVar3 = &fatbinary.Rule.field_2;
  fatbinary.Comment._M_string_length = 1;
  fatbinary.Comment.field_2._M_allocated_capacity = 0;
  fatbinary.Comment.field_2._8_8_ = 0;
  fatbinary.Rule._M_dataplus._M_p._0_4_ = 0x3f800000;
  fatbinary.Rule._M_string_length = 0;
  fatbinary.Rule.field_2._M_allocated_capacity = 0;
  fatbinary.Comment._M_dataplus._M_p = (pointer)paVar3;
  cmGeneratorTarget::GetLinkerLanguage
            (&dcompile.Comment,
             (this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.GeneratorTarget,
             config);
  cmNinjaTargetGenerator::ComputeLinkDeps
            ((cmNinjaDeps *)&linkLineComputer,&this->super_cmNinjaTargetGenerator,&dcompile.Comment,
             config,true);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)dcompile.Comment._M_dataplus._M_p != &dcompile.Comment.field_2) {
    operator_delete(dcompile.Comment._M_dataplus._M_p,
                    dcompile.Comment.field_2._M_allocated_capacity + 1);
  }
  cmNinjaTargetGenerator::GetObjects
            ((cmNinjaDeps *)&dcompile,&this->super_cmNinjaTargetGenerator,config);
  pcVar7 = linkLineComputer.super_cmLinkLineDeviceComputer.super_cmLinkLineComputer.StateDir.
           DirectoryState.Tree;
  if ((cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)
      linkLineComputer.super_cmLinkLineDeviceComputer.super_cmLinkLineComputer.
      _vptr_cmLinkLineComputer !=
      linkLineComputer.super_cmLinkLineDeviceComputer.super_cmLinkLineComputer.StateDir.
      DirectoryState.Tree) {
    pp_Var15 = linkLineComputer.super_cmLinkLineDeviceComputer.super_cmLinkLineComputer.
               _vptr_cmLinkLineComputer;
    frameworkPath._M_dataplus._M_p = (pointer)&fatbinary;
    do {
      std::
      _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
      ::
      _M_insert<std::__cxx11::string_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::__cxx11::string,true>>>>
                ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                  *)&fatbinary,pp_Var15,&frameworkPath);
      pp_Var15 = pp_Var15 + 4;
    } while ((cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)pp_Var15 != pcVar7);
  }
  sVar8 = dcompile.Comment._M_string_length;
  frameworkPath._M_dataplus._M_p = (pointer)&fatbinary;
  if (dcompile.Comment._M_dataplus._M_p != (pointer)dcompile.Comment._M_string_length) {
    _Var16._M_p = dcompile.Comment._M_dataplus._M_p;
    do {
      std::
      _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
      ::
      _M_insert<std::__cxx11::string_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::__cxx11::string,true>>>>
                ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                  *)&fatbinary,_Var16._M_p,&frameworkPath);
      _Var16._M_p = _Var16._M_p + 0x20;
    } while (_Var16._M_p != (pointer)sVar8);
  }
  explicitDeps.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  explicitDeps.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  explicitDeps.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (fatbinary.Comment.field_2._M_allocated_capacity != 0) {
    uVar13 = fatbinary.Comment.field_2._M_allocated_capacity;
    do {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&explicitDeps,(value_type *)(uVar13 + 8));
      uVar13 = *(undefined8 *)uVar13;
    } while (uVar13 != 0);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&dcompile);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&linkLineComputer);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                 *)&fatbinary);
  this_02 = cmNinjaTargetGenerator::GetGlobalGenerator(&this->super_cmNinjaTargetGenerator);
  cmGeneratorTarget::GetSupportDirectory_abi_cxx11_
            (&dcompile.Comment,
             (this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.GeneratorTarget);
  (*(this_02->super_cmGlobalCommonGenerator).super_cmGlobalGenerator._vptr_cmGlobalGenerator[0x4d])
            (&linkLineComputer,this_02,config);
  fatbinary.Comment._M_dataplus._M_p = (pointer)dcompile.Comment._M_string_length;
  fatbinary.Comment._M_string_length = (size_type)dcompile.Comment._M_dataplus._M_p;
  fatbinary.Comment.field_2._M_allocated_capacity = (size_type)&dcompile;
  fatbinary.Comment.field_2._8_8_ =
       linkLineComputer.super_cmLinkLineDeviceComputer.super_cmLinkLineComputer.StateDir.
       DirectoryState.Tree;
  fatbinary.Rule._M_dataplus._M_p =
       (pointer)linkLineComputer.super_cmLinkLineDeviceComputer.super_cmLinkLineComputer.
                _vptr_cmLinkLineComputer;
  views._M_len = 2;
  views._M_array = (iterator)&fatbinary;
  fatbinary.Rule._M_string_length = (size_type)&linkLineComputer;
  cmCatViews(&objectDir,views);
  pPVar1 = &linkLineComputer.super_cmLinkLineDeviceComputer.super_cmLinkLineComputer.StateDir.
            DirectoryState.Position;
  if (linkLineComputer.super_cmLinkLineDeviceComputer.super_cmLinkLineComputer.
      _vptr_cmLinkLineComputer != (_func_int **)pPVar1) {
    operator_delete(linkLineComputer.super_cmLinkLineDeviceComputer.super_cmLinkLineComputer.
                    _vptr_cmLinkLineComputer,
                    linkLineComputer.super_cmLinkLineDeviceComputer.super_cmLinkLineComputer.
                    StateDir.DirectoryState.Position + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)dcompile.Comment._M_dataplus._M_p != &dcompile.Comment.field_2) {
    operator_delete(dcompile.Comment._M_dataplus._M_p,
                    dcompile.Comment.field_2._M_allocated_capacity + 1);
  }
  this_03 = cmNinjaTargetGenerator::GetGlobalGenerator(&this->super_cmNinjaTargetGenerator);
  psVar10 = cmGlobalNinjaGenerator::ConvertToNinjaPath(this_03,&objectDir);
  ninjaOutputDir._M_dataplus._M_p = (pointer)&ninjaOutputDir.field_2;
  pcVar5 = (psVar10->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&ninjaOutputDir,pcVar5,pcVar5 + psVar10->_M_string_length);
  LanguageLinkerCudaFatbinaryRule(&local_170,this,config);
  fatbinary.Comment._M_dataplus._M_p = (pointer)&fatbinary.Comment.field_2;
  fatbinary.Comment._M_string_length = 0;
  fatbinary.Comment.field_2._M_allocated_capacity =
       fatbinary.Comment.field_2._M_allocated_capacity & 0xffffffffffffff00;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_170._M_dataplus._M_p == &local_170.field_2) {
    fatbinary.Rule.field_2._8_8_ = local_170.field_2._8_8_;
    fatbinary.Rule._M_dataplus._M_p = (pointer)paVar3;
  }
  else {
    fatbinary.Rule._M_dataplus._M_p = local_170._M_dataplus._M_p;
  }
  fatbinary.Rule._M_string_length = local_170._M_string_length;
  local_170._M_string_length = 0;
  local_170.field_2._M_local_buf[0] = '\0';
  p_Var4 = &fatbinary.Variables._M_t._M_impl.super__Rb_tree_header;
  fatbinary.Variables._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  fatbinary.Variables._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
  memset(&fatbinary.Outputs,0,0x90);
  fatbinary.Variables._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  fatbinary.RspFile._M_dataplus._M_p = (pointer)&fatbinary.RspFile.field_2;
  fatbinary.RspFile._M_string_length = 0;
  fatbinary.RspFile.field_2._M_local_buf[0] = '\0';
  pbVar14 = (architectures->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  pbVar6 = (architectures->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  fatbinary.Variables._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var4->_M_header;
  fatbinary.Variables._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var4->_M_header;
  if (pbVar14 != pbVar6) {
    do {
      std::__cxx11::string::find((char)pbVar14,0x2d);
      std::__cxx11::string::substr((ulong)&frameworkPath,(ulong)pbVar14);
      dcompile.Comment._M_dataplus._M_p = (pointer)ninjaOutputDir._M_string_length;
      dcompile.Comment._M_string_length = (size_type)ninjaOutputDir._M_dataplus._M_p;
      dcompile.Comment.field_2._M_allocated_capacity = 0;
      dcompile.Comment.field_2._8_8_ = 4;
      dcompile.Rule._M_dataplus._M_p = "/sm_";
      dcompile.Rule._M_string_length = 0;
      dcompile.Rule.field_2._M_allocated_capacity = frameworkPath._M_string_length;
      dcompile.Rule.field_2._8_8_ = frameworkPath._M_dataplus._M_p;
      dcompile.Outputs.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      dcompile.Outputs.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)&DAT_00000006;
      dcompile.Outputs.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)anon_var_dwarf_120f9fd;
      dcompile.ImplicitOuts.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      views_00._M_len = 4;
      views_00._M_array = (iterator)&dcompile;
      cmCatViews(&linkPath,views_00);
      LanguageLinkerCudaDeviceRule(&local_2f0,this,config);
      dcompile.Comment._M_dataplus._M_p = (pointer)&dcompile.Comment.field_2;
      dcompile.Comment._M_string_length = 0;
      dcompile.Comment.field_2._M_allocated_capacity =
           dcompile.Comment.field_2._M_allocated_capacity & 0xffffffffffffff00;
      dcompile.Rule._M_dataplus._M_p = (pointer)&dcompile.Rule.field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2f0._M_dataplus._M_p == &local_2f0.field_2) {
        dcompile.Rule.field_2._8_8_ = local_2f0.field_2._8_8_;
      }
      else {
        dcompile.Rule._M_dataplus._M_p = local_2f0._M_dataplus._M_p;
      }
      dcompile.Rule.field_2._M_allocated_capacity._1_7_ =
           local_2f0.field_2._M_allocated_capacity._1_7_;
      dcompile.Rule.field_2._M_local_buf[0] = local_2f0.field_2._M_local_buf[0];
      dcompile.Rule._M_string_length = local_2f0._M_string_length;
      local_2f0._M_string_length = 0;
      local_2f0.field_2._M_local_buf[0] = '\0';
      dcompile.Variables._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      dcompile.Variables._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      local_2f0._M_dataplus._M_p = (pointer)&local_2f0.field_2;
      memset(&dcompile.Outputs,0,0x90);
      dcompile.Variables._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &dcompile.Variables._M_t._M_impl.super__Rb_tree_header._M_header;
      dcompile.Variables._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      dcompile.RspFile._M_dataplus._M_p = (pointer)&dcompile.RspFile.field_2;
      dcompile.RspFile._M_string_length = 0;
      dcompile.RspFile.field_2._M_local_buf[0] = '\0';
      dcompile.Variables._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           dcompile.Variables._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator=(&dcompile.ExplicitDeps,&explicitDeps);
      linkLineComputer.super_cmLinkLineDeviceComputer.super_cmLinkLineComputer.
      _vptr_cmLinkLineComputer = (_func_int **)pPVar1;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&linkLineComputer,linkPath._M_dataplus._M_p,
                 linkPath._M_dataplus._M_p + linkPath._M_string_length);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      _M_assign_aux<std::__cxx11::string_const*>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 &dcompile.Outputs,&linkLineComputer,
                 &linkLineComputer.super_cmLinkLineDeviceComputer.super_cmLinkLineComputer.StateDir.
                  Snapshot_.Position);
      if (linkLineComputer.super_cmLinkLineDeviceComputer.super_cmLinkLineComputer.
          _vptr_cmLinkLineComputer != (_func_int **)pPVar1) {
        operator_delete(linkLineComputer.super_cmLinkLineDeviceComputer.super_cmLinkLineComputer.
                        _vptr_cmLinkLineComputer,
                        linkLineComputer.super_cmLinkLineDeviceComputer.super_cmLinkLineComputer.
                        StateDir.DirectoryState.Position + 1);
      }
      linkLineComputer.super_cmLinkLineDeviceComputer.super_cmLinkLineComputer.
      _vptr_cmLinkLineComputer = (_func_int **)0x3;
      linkLineComputer.super_cmLinkLineDeviceComputer.super_cmLinkLineComputer.StateDir.
      DirectoryState.Tree = (cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)0x7fb891;
      linkLineComputer.super_cmLinkLineDeviceComputer.super_cmLinkLineComputer.StateDir.
      DirectoryState.Position = 0;
      linkLineComputer.super_cmLinkLineDeviceComputer.super_cmLinkLineComputer.StateDir.Snapshot_.
      State = (cmState *)frameworkPath._M_string_length;
      linkLineComputer.super_cmLinkLineDeviceComputer.super_cmLinkLineComputer.StateDir.Snapshot_.
      Position.Tree =
           (cmLinkedTree<cmStateDetail::SnapshotDataType> *)frameworkPath._M_dataplus._M_p;
      linkLineComputer.super_cmLinkLineDeviceComputer.super_cmLinkLineComputer.StateDir.Snapshot_.
      Position.Position = 0;
      views_01._M_len = 2;
      views_01._M_array = (iterator)&linkLineComputer;
      cmCatViews(&linkLibs,views_01);
      linkLineComputer.super_cmLinkLineDeviceComputer.super_cmLinkLineComputer.
      _vptr_cmLinkLineComputer = (_func_int **)pPVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&linkLineComputer,"ARCH","");
      pmVar11 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[](&dcompile.Variables,(key_type *)&linkLineComputer);
      std::__cxx11::string::operator=((string *)pmVar11,(string *)&linkLibs);
      if (linkLineComputer.super_cmLinkLineDeviceComputer.super_cmLinkLineComputer.
          _vptr_cmLinkLineComputer != (_func_int **)pPVar1) {
        operator_delete(linkLineComputer.super_cmLinkLineDeviceComputer.super_cmLinkLineComputer.
                        _vptr_cmLinkLineComputer,
                        linkLineComputer.super_cmLinkLineDeviceComputer.super_cmLinkLineComputer.
                        StateDir.DirectoryState.Position + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)linkLibs._M_dataplus._M_p != &linkLibs.field_2) {
        operator_delete(linkLibs._M_dataplus._M_p,
                        CONCAT71(linkLibs.field_2._M_allocated_capacity._1_7_,
                                 linkLibs.field_2._M_local_buf[0]) + 1);
      }
      if (fatbinary.ExplicitDeps.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start ==
          fatbinary.ExplicitDeps.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        linkLineComputer.super_cmLinkLineDeviceComputer.super_cmLinkLineComputer.
        _vptr_cmLinkLineComputer = (_func_int **)&DAT_00000019;
        linkLineComputer.super_cmLinkLineDeviceComputer.super_cmLinkLineComputer.StateDir.
        DirectoryState.Tree = (cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)0x823fc2
        ;
        linkLineComputer.super_cmLinkLineDeviceComputer.super_cmLinkLineComputer.StateDir.
        DirectoryState.Position = 0;
        linkLineComputer.super_cmLinkLineDeviceComputer.super_cmLinkLineComputer.StateDir.Snapshot_.
        State = (cmState *)ninjaOutputDir._M_string_length;
        linkLineComputer.super_cmLinkLineDeviceComputer.super_cmLinkLineComputer.StateDir.Snapshot_.
        Position.Tree =
             (cmLinkedTree<cmStateDetail::SnapshotDataType> *)ninjaOutputDir._M_dataplus._M_p;
        linkLineComputer.super_cmLinkLineDeviceComputer.super_cmLinkLineComputer.StateDir.Snapshot_.
        Position.Position = 0;
        linkLineComputer.super_cmLinkLineDeviceComputer.super_cmLinkLineComputer.OutputConverter =
             (cmOutputConverter *)0x16;
        linkLineComputer.super_cmLinkLineDeviceComputer.super_cmLinkLineComputer._56_8_ =
             anon_var_dwarf_120fa3b;
        linkLineComputer.GG = (cmGlobalNinjaGenerator *)0x0;
        views_02._M_len = 3;
        views_02._M_array = (iterator)&linkLineComputer;
        cmCatViews(&linkLibs,views_02);
        linkLineComputer.super_cmLinkLineDeviceComputer.super_cmLinkLineComputer.
        _vptr_cmLinkLineComputer = (_func_int **)pPVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)&linkLineComputer,"REGISTER","");
        pmVar11 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator[](&dcompile.Variables,(key_type *)&linkLineComputer);
        std::__cxx11::string::operator=((string *)pmVar11,(string *)&linkLibs);
        if (linkLineComputer.super_cmLinkLineDeviceComputer.super_cmLinkLineComputer.
            _vptr_cmLinkLineComputer != (_func_int **)pPVar1) {
          operator_delete(linkLineComputer.super_cmLinkLineDeviceComputer.super_cmLinkLineComputer.
                          _vptr_cmLinkLineComputer,
                          linkLineComputer.super_cmLinkLineDeviceComputer.super_cmLinkLineComputer.
                          StateDir.DirectoryState.Position + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)linkLibs._M_dataplus._M_p != &linkLibs.field_2) {
          operator_delete(linkLibs._M_dataplus._M_p,
                          CONCAT71(linkLibs.field_2._M_allocated_capacity._1_7_,
                                   linkLibs.field_2._M_local_buf[0]) + 1);
        }
      }
      linkLineComputer.super_cmLinkLineDeviceComputer.super_cmLinkLineComputer.
      _vptr_cmLinkLineComputer = (_func_int **)0x10;
      linkLineComputer.super_cmLinkLineDeviceComputer.super_cmLinkLineComputer.StateDir.
      DirectoryState.Tree =
           (cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)anon_var_dwarf_120fa53;
      linkLineComputer.super_cmLinkLineDeviceComputer.super_cmLinkLineComputer.StateDir.
      DirectoryState.Position = 0;
      linkLineComputer.super_cmLinkLineDeviceComputer.super_cmLinkLineComputer.StateDir.Snapshot_.
      State = (cmState *)frameworkPath._M_string_length;
      linkLineComputer.super_cmLinkLineDeviceComputer.super_cmLinkLineComputer.StateDir.Snapshot_.
      Position.Tree =
           (cmLinkedTree<cmStateDetail::SnapshotDataType> *)frameworkPath._M_dataplus._M_p;
      linkLineComputer.super_cmLinkLineDeviceComputer.super_cmLinkLineComputer.StateDir.Snapshot_.
      Position.Position = 0;
      linkLineComputer.super_cmLinkLineDeviceComputer.super_cmLinkLineComputer.OutputConverter =
           (cmOutputConverter *)&DAT_00000006;
      linkLineComputer.super_cmLinkLineDeviceComputer.super_cmLinkLineComputer._56_8_ =
           anon_var_dwarf_120fa5f;
      linkLineComputer.GG = (cmGlobalNinjaGenerator *)0x0;
      views_03._M_len = 4;
      views_03._M_array = (iterator)&linkLineComputer;
      cmCatViews(&linkLibs,views_03);
      linkLineComputer.super_cmLinkLineDeviceComputer.super_cmLinkLineComputer.
      _vptr_cmLinkLineComputer = (_func_int **)pPVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&linkLineComputer,"PROFILES","");
      pmVar11 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[](&fatbinary.Variables,(key_type *)&linkLineComputer);
      std::__cxx11::string::_M_append((char *)pmVar11,(ulong)linkLibs._M_dataplus._M_p);
      if (linkLineComputer.super_cmLinkLineDeviceComputer.super_cmLinkLineComputer.
          _vptr_cmLinkLineComputer != (_func_int **)pPVar1) {
        operator_delete(linkLineComputer.super_cmLinkLineDeviceComputer.super_cmLinkLineComputer.
                        _vptr_cmLinkLineComputer,
                        linkLineComputer.super_cmLinkLineDeviceComputer.super_cmLinkLineComputer.
                        StateDir.DirectoryState.Position + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)linkLibs._M_dataplus._M_p != &linkLibs.field_2) {
        operator_delete(linkLibs._M_dataplus._M_p,
                        CONCAT71(linkLibs.field_2._M_allocated_capacity._1_7_,
                                 linkLibs.field_2._M_local_buf[0]) + 1);
      }
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string_const&>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 &fatbinary.ExplicitDeps,&linkPath);
      pcVar12 = cmNinjaTargetGenerator::GetCommonFileStream(&this->super_cmNinjaTargetGenerator);
      cmGlobalNinjaGenerator::WriteBuild(this_02,(ostream *)pcVar12,&dcompile,0,(bool *)0x0);
      cmNinjaBuild::~cmNinjaBuild(&dcompile);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)linkPath._M_dataplus._M_p != &linkPath.field_2) {
        operator_delete(linkPath._M_dataplus._M_p,
                        CONCAT71(linkPath.field_2._M_allocated_capacity._1_7_,
                                 linkPath.field_2._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)frameworkPath._M_dataplus._M_p != &frameworkPath.field_2) {
        operator_delete(frameworkPath._M_dataplus._M_p,
                        CONCAT71(frameworkPath.field_2._M_allocated_capacity._1_7_,
                                 frameworkPath.field_2._M_local_buf[0]) + 1);
      }
      pbVar14 = pbVar14 + 1;
    } while (pbVar14 != pbVar6);
  }
  dcompile.Comment._M_dataplus._M_p = (pointer)ninjaOutputDir._M_string_length;
  dcompile.Comment._M_string_length = (size_type)ninjaOutputDir._M_dataplus._M_p;
  dcompile.Comment.field_2._M_allocated_capacity = 0;
  dcompile.Comment.field_2._8_8_ = 0x14;
  dcompile.Rule._M_dataplus._M_p = "/cmake_cuda_fatbin.h";
  dcompile.Rule._M_string_length = 0;
  views_04._M_len = 2;
  views_04._M_array = (iterator)&dcompile;
  cmCatViews((string *)&linkLineComputer,views_04);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  _M_assign_aux<std::__cxx11::string_const*>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&fatbinary.Outputs
             ,&linkLineComputer,
             &linkLineComputer.super_cmLinkLineDeviceComputer.super_cmLinkLineComputer.StateDir.
              Snapshot_.Position);
  if (linkLineComputer.super_cmLinkLineDeviceComputer.super_cmLinkLineComputer.
      _vptr_cmLinkLineComputer != (_func_int **)pPVar1) {
    operator_delete(linkLineComputer.super_cmLinkLineDeviceComputer.super_cmLinkLineComputer.
                    _vptr_cmLinkLineComputer,
                    linkLineComputer.super_cmLinkLineDeviceComputer.super_cmLinkLineComputer.
                    StateDir.DirectoryState.Position + 1);
  }
  pcVar12 = cmNinjaTargetGenerator::GetCommonFileStream(&this->super_cmNinjaTargetGenerator);
  cmGlobalNinjaGenerator::WriteBuild(this_02,(ostream *)pcVar12,&fatbinary,0,(bool *)0x0);
  this_01 = (this->super_cmNinjaTargetGenerator).LocalGenerator;
  LanguageLinkerCudaDeviceCompileRule(&local_190,this,config);
  dcompile.Rule._M_dataplus._M_p = (pointer)&dcompile.Rule.field_2;
  dcompile.Comment._M_dataplus._M_p = (pointer)&dcompile.Comment.field_2;
  dcompile.Comment._M_string_length = 0;
  dcompile.Comment.field_2._M_allocated_capacity =
       dcompile.Comment.field_2._M_allocated_capacity & 0xffffffffffffff00;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_190._M_dataplus._M_p == &local_190.field_2) {
    dcompile.Rule.field_2._8_8_ = local_190.field_2._8_8_;
  }
  else {
    dcompile.Rule._M_dataplus._M_p = local_190._M_dataplus._M_p;
  }
  dcompile.Rule._M_string_length = local_190._M_string_length;
  local_190._M_string_length = 0;
  local_190.field_2._M_local_buf[0] = '\0';
  p_Var4 = &dcompile.Variables._M_t._M_impl.super__Rb_tree_header;
  dcompile.Variables._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  dcompile.Variables._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
  memset(&dcompile.Outputs,0,0x90);
  dcompile.Variables._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  dcompile.RspFile._M_dataplus._M_p = (pointer)&dcompile.RspFile.field_2;
  dcompile.RspFile._M_string_length = 0;
  dcompile.RspFile.field_2._M_local_buf[0] = '\0';
  pcVar5 = (output->_M_dataplus)._M_p;
  linkLineComputer.super_cmLinkLineDeviceComputer.super_cmLinkLineComputer._vptr_cmLinkLineComputer
       = (_func_int **)pPVar1;
  dcompile.Variables._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var4->_M_header;
  dcompile.Variables._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var4->_M_header;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&linkLineComputer,pcVar5,pcVar5 + output->_M_string_length);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  _M_assign_aux<std::__cxx11::string_const*>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&dcompile.Outputs,
             &linkLineComputer,
             &linkLineComputer.super_cmLinkLineDeviceComputer.super_cmLinkLineComputer.StateDir.
              Snapshot_.Position);
  if (linkLineComputer.super_cmLinkLineDeviceComputer.super_cmLinkLineComputer.
      _vptr_cmLinkLineComputer != (_func_int **)pPVar1) {
    operator_delete(linkLineComputer.super_cmLinkLineDeviceComputer.super_cmLinkLineComputer.
                    _vptr_cmLinkLineComputer,
                    linkLineComputer.super_cmLinkLineDeviceComputer.super_cmLinkLineComputer.
                    StateDir.DirectoryState.Position + 1);
  }
  linkLineComputer.super_cmLinkLineDeviceComputer.super_cmLinkLineComputer._vptr_cmLinkLineComputer
       = (_func_int **)ninjaOutputDir._M_string_length;
  linkLineComputer.super_cmLinkLineDeviceComputer.super_cmLinkLineComputer.StateDir.DirectoryState.
  Tree = (cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)
         ninjaOutputDir._M_dataplus._M_p;
  linkLineComputer.super_cmLinkLineDeviceComputer.super_cmLinkLineComputer.StateDir.DirectoryState.
  Position = 0;
  linkLineComputer.super_cmLinkLineDeviceComputer.super_cmLinkLineComputer.StateDir.Snapshot_.State
       = (cmState *)&DAT_00000014;
  linkLineComputer.super_cmLinkLineDeviceComputer.super_cmLinkLineComputer.StateDir.Snapshot_.
  Position.Tree = (cmLinkedTree<cmStateDetail::SnapshotDataType> *)anon_var_dwarf_120fa77;
  linkLineComputer.super_cmLinkLineDeviceComputer.super_cmLinkLineComputer.StateDir.Snapshot_.
  Position.Position = 0;
  views_05._M_len = 2;
  views_05._M_array = (iterator)&linkLineComputer;
  cmCatViews(&frameworkPath,views_05);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  _M_assign_aux<std::__cxx11::string_const*>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
             &dcompile.ExplicitDeps,&frameworkPath,local_428);
  paVar3 = &frameworkPath.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)frameworkPath._M_dataplus._M_p != paVar3) {
    operator_delete(frameworkPath._M_dataplus._M_p,
                    CONCAT71(frameworkPath.field_2._M_allocated_capacity._1_7_,
                             frameworkPath.field_2._M_local_buf[0]) + 1);
  }
  linkLineComputer.super_cmLinkLineDeviceComputer.super_cmLinkLineComputer._vptr_cmLinkLineComputer
       = (_func_int **)objectDir._M_string_length;
  linkLineComputer.super_cmLinkLineDeviceComputer.super_cmLinkLineComputer.StateDir.DirectoryState.
  Tree = (cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)objectDir._M_dataplus._M_p;
  linkLineComputer.super_cmLinkLineDeviceComputer.super_cmLinkLineComputer.StateDir.DirectoryState.
  Position = 0;
  linkLineComputer.super_cmLinkLineDeviceComputer.super_cmLinkLineComputer.StateDir.Snapshot_.State
       = (cmState *)&DAT_00000014;
  linkLineComputer.super_cmLinkLineDeviceComputer.super_cmLinkLineComputer.StateDir.Snapshot_.
  Position.Tree = (cmLinkedTree<cmStateDetail::SnapshotDataType> *)anon_var_dwarf_120fa77;
  linkLineComputer.super_cmLinkLineDeviceComputer.super_cmLinkLineComputer.StateDir.Snapshot_.
  Position.Position = 0;
  views_06._M_len = 2;
  views_06._M_array = (iterator)&linkLineComputer;
  cmCatViews(&linkPath,views_06);
  source._M_str = linkPath._M_dataplus._M_p;
  source._M_len = linkPath._M_string_length;
  cmOutputConverter::ConvertToOutputFormat_abi_cxx11_
            (&frameworkPath,(cmOutputConverter *)this_01,source,SHELL,false);
  linkLineComputer.super_cmLinkLineDeviceComputer.super_cmLinkLineComputer._vptr_cmLinkLineComputer
       = (_func_int **)pPVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&linkLineComputer,"FATBIN","");
  this_00 = &dcompile.Variables;
  pmVar11 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](this_00,(key_type *)&linkLineComputer);
  std::__cxx11::string::operator=((string *)pmVar11,(string *)&frameworkPath);
  if (linkLineComputer.super_cmLinkLineDeviceComputer.super_cmLinkLineComputer.
      _vptr_cmLinkLineComputer != (_func_int **)pPVar1) {
    operator_delete(linkLineComputer.super_cmLinkLineDeviceComputer.super_cmLinkLineComputer.
                    _vptr_cmLinkLineComputer,
                    linkLineComputer.super_cmLinkLineDeviceComputer.super_cmLinkLineComputer.
                    StateDir.DirectoryState.Position + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)frameworkPath._M_dataplus._M_p != paVar3) {
    operator_delete(frameworkPath._M_dataplus._M_p,
                    CONCAT71(frameworkPath.field_2._M_allocated_capacity._1_7_,
                             frameworkPath.field_2._M_local_buf[0]) + 1);
  }
  paVar2 = &linkPath.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)linkPath._M_dataplus._M_p != paVar2) {
    operator_delete(linkPath._M_dataplus._M_p,
                    CONCAT71(linkPath.field_2._M_allocated_capacity._1_7_,
                             linkPath.field_2._M_local_buf[0]) + 1);
  }
  linkLineComputer.super_cmLinkLineDeviceComputer.super_cmLinkLineComputer._vptr_cmLinkLineComputer
       = (_func_int **)objectDir._M_string_length;
  linkLineComputer.super_cmLinkLineDeviceComputer.super_cmLinkLineComputer.StateDir.DirectoryState.
  Tree = (cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)objectDir._M_dataplus._M_p;
  linkLineComputer.super_cmLinkLineDeviceComputer.super_cmLinkLineComputer.StateDir.DirectoryState.
  Position = 0;
  linkLineComputer.super_cmLinkLineDeviceComputer.super_cmLinkLineComputer.StateDir.Snapshot_.State
       = (cmState *)0x16;
  linkLineComputer.super_cmLinkLineDeviceComputer.super_cmLinkLineComputer.StateDir.Snapshot_.
  Position.Tree = (cmLinkedTree<cmStateDetail::SnapshotDataType> *)anon_var_dwarf_120fa3b;
  linkLineComputer.super_cmLinkLineDeviceComputer.super_cmLinkLineComputer.StateDir.Snapshot_.
  Position.Position = 0;
  views_07._M_len = 2;
  views_07._M_array = (iterator)&linkLineComputer;
  cmCatViews(&linkPath,views_07);
  source_00._M_str = linkPath._M_dataplus._M_p;
  source_00._M_len = linkPath._M_string_length;
  cmOutputConverter::ConvertToOutputFormat_abi_cxx11_
            (&frameworkPath,(cmOutputConverter *)this_01,source_00,SHELL,false);
  linkLineComputer.super_cmLinkLineDeviceComputer.super_cmLinkLineComputer._vptr_cmLinkLineComputer
       = (_func_int **)pPVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&linkLineComputer,"REGISTER","");
  pmVar11 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](this_00,(key_type *)&linkLineComputer);
  std::__cxx11::string::operator=((string *)pmVar11,(string *)&frameworkPath);
  if (linkLineComputer.super_cmLinkLineDeviceComputer.super_cmLinkLineComputer.
      _vptr_cmLinkLineComputer != (_func_int **)pPVar1) {
    operator_delete(linkLineComputer.super_cmLinkLineDeviceComputer.super_cmLinkLineComputer.
                    _vptr_cmLinkLineComputer,
                    linkLineComputer.super_cmLinkLineDeviceComputer.super_cmLinkLineComputer.
                    StateDir.DirectoryState.Position + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)frameworkPath._M_dataplus._M_p != paVar3) {
    operator_delete(frameworkPath._M_dataplus._M_p,
                    CONCAT71(frameworkPath.field_2._M_allocated_capacity._1_7_,
                             frameworkPath.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)linkPath._M_dataplus._M_p != paVar2) {
    operator_delete(linkPath._M_dataplus._M_p,
                    CONCAT71(linkPath.field_2._M_allocated_capacity._1_7_,
                             linkPath.field_2._M_local_buf[0]) + 1);
  }
  cmLocalGenerator::GetStateSnapshot((cmStateSnapshot *)&linkPath,(cmLocalGenerator *)this_01);
  cmStateSnapshot::GetDirectory((cmStateDirectory *)&frameworkPath,(cmStateSnapshot *)&linkPath);
  cmNinjaLinkLineDeviceComputer::cmNinjaLinkLineDeviceComputer
            (&linkLineComputer,(cmOutputConverter *)this_01,(cmStateDirectory *)&frameworkPath,
             this_02);
  iVar9 = (*(this_02->super_cmGlobalCommonGenerator).super_cmGlobalGenerator._vptr_cmGlobalGenerator
            [0x28])();
  cmLinkLineComputer::SetUseNinjaMulti((cmLinkLineComputer *)&linkLineComputer,SUB41(iVar9,0));
  frameworkPath._M_string_length = 0;
  frameworkPath.field_2._M_local_buf[0] = '\0';
  linkPath._M_string_length = 0;
  linkPath.field_2._M_local_buf[0] = '\0';
  linkLibs._M_string_length = 0;
  linkLibs.field_2._M_local_buf[0] = '\0';
  frameworkPath._M_dataplus._M_p = (pointer)paVar3;
  linkPath._M_dataplus._M_p = (pointer)paVar2;
  linkLibs._M_dataplus._M_p = (pointer)&linkLibs.field_2;
  local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b0,"LINK_FLAGS","");
  pmVar11 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](this_00,&local_1b0);
  cmLocalGenerator::GetDeviceLinkFlags
            ((cmLocalGenerator *)this_01,&linkLineComputer.super_cmLinkLineDeviceComputer,config,
             &linkLibs,pmVar11,&frameworkPath,&linkPath,
             (this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.GeneratorTarget);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
    operator_delete(local_1b0._M_dataplus._M_p,local_1b0.field_2._M_allocated_capacity + 1);
  }
  pcVar12 = cmNinjaTargetGenerator::GetCommonFileStream(&this->super_cmNinjaTargetGenerator);
  cmGlobalNinjaGenerator::WriteBuild(this_02,(ostream *)pcVar12,&dcompile,0,(bool *)0x0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)linkLibs._M_dataplus._M_p != &linkLibs.field_2) {
    operator_delete(linkLibs._M_dataplus._M_p,
                    CONCAT71(linkLibs.field_2._M_allocated_capacity._1_7_,
                             linkLibs.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)linkPath._M_dataplus._M_p != paVar2) {
    operator_delete(linkPath._M_dataplus._M_p,
                    CONCAT71(linkPath.field_2._M_allocated_capacity._1_7_,
                             linkPath.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)frameworkPath._M_dataplus._M_p != &frameworkPath.field_2) {
    operator_delete(frameworkPath._M_dataplus._M_p,
                    CONCAT71(frameworkPath.field_2._M_allocated_capacity._1_7_,
                             frameworkPath.field_2._M_local_buf[0]) + 1);
  }
  cmLinkLineDeviceComputer::~cmLinkLineDeviceComputer
            (&linkLineComputer.super_cmLinkLineDeviceComputer);
  cmNinjaBuild::~cmNinjaBuild(&dcompile);
  cmNinjaBuild::~cmNinjaBuild(&fatbinary);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)ninjaOutputDir._M_dataplus._M_p != &ninjaOutputDir.field_2) {
    operator_delete(ninjaOutputDir._M_dataplus._M_p,ninjaOutputDir.field_2._M_allocated_capacity + 1
                   );
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)objectDir._M_dataplus._M_p != &objectDir.field_2) {
    operator_delete(objectDir._M_dataplus._M_p,objectDir.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&explicitDeps);
  return;
}

Assistant:

void cmNinjaNormalTargetGenerator::WriteDeviceLinkStatements(
  const std::string& config, const std::vector<std::string>& architectures,
  const std::string& output)
{
  // Ensure there are no duplicates.
  const cmNinjaDeps explicitDeps = [&]() -> std::vector<std::string> {
    std::unordered_set<std::string> depsSet;
    const cmNinjaDeps linkDeps =
      this->ComputeLinkDeps(this->TargetLinkLanguage(config), config, true);
    const cmNinjaDeps objects = this->GetObjects(config);
    depsSet.insert(linkDeps.begin(), linkDeps.end());
    depsSet.insert(objects.begin(), objects.end());

    std::vector<std::string> deps;
    std::copy(depsSet.begin(), depsSet.end(), std::back_inserter(deps));
    return deps;
  }();

  cmGlobalNinjaGenerator* globalGen{ this->GetGlobalGenerator() };
  const std::string objectDir =
    cmStrCat(this->GeneratorTarget->GetSupportDirectory(),
             globalGen->ConfigDirectory(config));
  const std::string ninjaOutputDir = this->ConvertToNinjaPath(objectDir);

  cmNinjaBuild fatbinary(this->LanguageLinkerCudaFatbinaryRule(config));

  // Link device code for each architecture.
  for (const std::string& architectureKind : architectures) {
    // Clang always generates real code, so strip the specifier.
    const std::string architecture =
      architectureKind.substr(0, architectureKind.find('-'));
    const std::string cubin =
      cmStrCat(ninjaOutputDir, "/sm_", architecture, ".cubin");

    cmNinjaBuild dlink(this->LanguageLinkerCudaDeviceRule(config));
    dlink.ExplicitDeps = explicitDeps;
    dlink.Outputs = { cubin };
    dlink.Variables["ARCH"] = cmStrCat("sm_", architecture);

    // The generated register file contains macros that when expanded register
    // the device routines. Because the routines are the same for all
    // architectures the register file will be the same too. Thus generate it
    // only on the first invocation to reduce overhead.
    if (fatbinary.ExplicitDeps.empty()) {
      dlink.Variables["REGISTER"] = cmStrCat(
        "--register-link-binaries=", ninjaOutputDir, "/cmake_cuda_register.h");
    }

    fatbinary.Variables["PROFILES"] +=
      cmStrCat(" -im=profile=sm_", architecture, ",file=", cubin);
    fatbinary.ExplicitDeps.emplace_back(cubin);

    globalGen->WriteBuild(this->GetCommonFileStream(), dlink);
  }

  // Combine all architectures into a single fatbinary.
  fatbinary.Outputs = { cmStrCat(ninjaOutputDir, "/cmake_cuda_fatbin.h") };
  globalGen->WriteBuild(this->GetCommonFileStream(), fatbinary);

  // Compile the stub that registers the kernels and contains the fatbinaries.
  cmLocalNinjaGenerator* localGen{ this->GetLocalGenerator() };
  cmNinjaBuild dcompile(this->LanguageLinkerCudaDeviceCompileRule(config));
  dcompile.Outputs = { output };
  dcompile.ExplicitDeps = { cmStrCat(ninjaOutputDir, "/cmake_cuda_fatbin.h") };
  dcompile.Variables["FATBIN"] = localGen->ConvertToOutputFormat(
    cmStrCat(objectDir, "/cmake_cuda_fatbin.h"), cmOutputConverter::SHELL);
  dcompile.Variables["REGISTER"] = localGen->ConvertToOutputFormat(
    cmStrCat(objectDir, "/cmake_cuda_register.h"), cmOutputConverter::SHELL);

  cmNinjaLinkLineDeviceComputer linkLineComputer(
    localGen, localGen->GetStateSnapshot().GetDirectory(), globalGen);
  linkLineComputer.SetUseNinjaMulti(globalGen->IsMultiConfig());

  // Link libraries and paths are only used during the final executable/library
  // link.
  std::string frameworkPath;
  std::string linkPath;
  std::string linkLibs;
  localGen->GetDeviceLinkFlags(linkLineComputer, config, linkLibs,
                               dcompile.Variables["LINK_FLAGS"], frameworkPath,
                               linkPath, this->GetGeneratorTarget());

  globalGen->WriteBuild(this->GetCommonFileStream(), dcompile);
}